

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>,-1,-1,false>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
               *lhs,Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
                    *rhs,Scalar *alpha)

{
  long lVar1;
  double *pdVar2;
  char *__function;
  double *pdVar3;
  long lVar4;
  double dVar5;
  const_blas_data_mapper<double,_long,_1> local_20;
  const_blas_data_mapper<double,_long,_0> local_10;
  
  lVar1 = (lhs->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
          .m_rows.m_value;
  if (lVar1 != 1) {
    local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
         .m_data;
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         (rhs->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
         .m_data;
    local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
         (((lhs->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
           .m_xpr.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_xpr
          )->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(lVar1,(lhs->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                .m_cols.m_value,&local_10,&local_20,*(ResScalar **)dst,1,*alpha);
    return;
  }
  pdVar3 = (lhs->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
           .m_data;
  lVar1 = (lhs->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
          .m_cols.m_value;
  if (lVar1 < 0 && pdVar3 != (double *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>, Level = 0]"
    ;
  }
  else {
    pdVar2 = (rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
             .m_data;
    lVar4 = (rhs->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
            .m_rows.m_value;
    if (-1 < lVar4 || pdVar2 == (double *)0x0) {
      if (lVar1 != lVar4) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>, OtherDerived = Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, -1, 1, true>]"
                     );
      }
      if (lVar1 == 0) {
        dVar5 = 0.0;
      }
      else {
        if (lVar1 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, -1, true>>, 1>>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        dVar5 = *pdVar3 * *pdVar2;
        if (lVar1 != 1) {
          lVar4 = 1;
          do {
            pdVar3 = pdVar3 + (((lhs->
                                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
                                ).
                                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                                .m_xpr.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
                               .m_xpr)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_rows;
            dVar5 = dVar5 + *pdVar3 * pdVar2[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar1 != lVar4);
        }
      }
      **(double **)dst = *alpha * dVar5 + **(double **)dst;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }